

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Vec_Int_t * Gia_ManComputeCarryOuts(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Tim_Man_t *p_00;
  undefined8 uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_01;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar4 = Tim_ManBoxNum(p_00);
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar9 = iVar4;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar9;
  if (iVar9 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar9 << 2);
  }
  p_01->pArray = piVar7;
  if (0 < iVar4) {
    iVar9 = 0;
    do {
      uVar5 = Tim_ManBoxInputLast(p_00,iVar9);
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = p->vCos->pArray[uVar5];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs + iVar6;
      uVar8 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
      if (((uint)*(undefined8 *)(pGVar1 + -uVar8) & 0x9fffffff) == 0x9fffffff) {
        iVar6 = Tim_ManBoxForCi(p_00,(uint)((ulong)*(undefined8 *)(pGVar1 + -uVar8) >> 0x20) &
                                     0x1fffffff);
        if (iVar6 != -1) {
          pGVar1 = pGVar1 + -uVar8;
          uVar2 = *(undefined8 *)pGVar1;
          if (((uint)uVar2 & 0x9fffffff) != 0x9fffffff) {
            __assert_fail("Gia_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,400,"Vec_Int_t *Gia_ManComputeCarryOuts(Gia_Man_t *)");
          }
          uVar5 = Tim_ManBoxOutputLast(p_00,iVar6);
          if (((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff) == uVar5) {
            pGVar3 = p->pObjs;
            if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_01,(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555);
          }
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar4 != iVar9);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Gia_ManComputeCarryOuts( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int i, iLast, iBox, nBoxes =  Tim_ManBoxNum( pManTime );
    Vec_Int_t * vCarryOuts = Vec_IntAlloc( nBoxes );
    for ( i = 0; i < nBoxes; i++ )
    {
        iLast = Tim_ManBoxInputLast( pManTime, i );
        pObj = Gia_ObjFanin0( Gia_ManCo(p, iLast) );
        if ( !Gia_ObjIsCi(pObj) )
            continue;
        iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
        if ( iBox == -1 ) 
            continue;
        assert( Gia_ObjIsCi(pObj) );
        if ( Gia_ObjCioId(pObj) == Tim_ManBoxOutputLast(pManTime, iBox) )
            Vec_IntPush( vCarryOuts, Gia_ObjId(p, pObj) );
    }
    return vCarryOuts;
}